

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O3

void lj_err_argtype(lua_State *L,int narg,char *xname)

{
  uint uVar1;
  TValue *pTVar2;
  char **ppcVar3;
  char *msg;
  TValue *pTVar4;
  ulong uVar5;
  
  if (narg < -9999) {
    if (0xffffd8ed < (uint)narg) {
      ppcVar3 = lj_obj_itypename + 0xb;
      goto LAB_00114678;
    }
    uVar5 = (ulong)L->base[-1].u32.lo;
    if ((uint)*(byte *)(uVar5 + 7) < -narg - 0x2712U) goto LAB_00114671;
    uVar1 = *(uint *)(uVar5 + 0x24 + (ulong)(-narg - 0x2713) * 8);
  }
  else {
    if (narg < 0) {
      pTVar2 = L->top;
      pTVar4 = pTVar2 + narg;
    }
    else {
      pTVar2 = L->top;
      pTVar4 = L->base + ((ulong)(uint)narg - 1);
    }
    if (pTVar2 <= pTVar4) {
LAB_00114671:
      ppcVar3 = lj_obj_typename;
      goto LAB_00114678;
    }
    uVar1 = (pTVar4->field_2).it;
  }
  uVar5 = 0xd;
  if ((0xfffeffff < uVar1) && (uVar5 = 3, (uVar1 & 0xffff8000) != 0xffff0000)) {
    uVar5 = (ulong)~uVar1;
  }
  ppcVar3 = lj_obj_itypename + uVar5;
LAB_00114678:
  msg = lj_strfmt_pushf(L,lj_err_allmsg + 0x205,xname,*ppcVar3);
  err_argmsg(L,narg,msg);
}

Assistant:

LJ_NOINLINE void lj_err_argtype(lua_State *L, int narg, const char *xname)
{
  const char *tname, *msg;
  if (narg <= LUA_REGISTRYINDEX) {
    if (narg >= LUA_GLOBALSINDEX) {
      tname = lj_obj_itypename[~LJ_TTAB];
    } else {
      GCfunc *fn = curr_func(L);
      int idx = LUA_GLOBALSINDEX - narg;
      if (idx <= fn->c.nupvalues)
	tname = lj_typename(&fn->c.upvalue[idx-1]);
      else
	tname = lj_obj_typename[0];
    }
  } else {
    TValue *o = narg < 0 ? L->top + narg : L->base + narg-1;
    tname = o < L->top ? lj_typename(o) : lj_obj_typename[0];
  }
  msg = lj_strfmt_pushf(L, err2msg(LJ_ERR_BADTYPE), xname, tname);
  err_argmsg(L, narg, msg);
}